

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecyclerTestObject.h
# Opt level: O0

bool __thiscall
TrackedObject<51U,_1000U>::TryGetRandomLocation(TrackedObject<51U,_1000U> *this,Location *location)

{
  uint uVar1;
  Location LVar2;
  Location *location_local;
  TrackedObject<51U,_1000U> *this_local;
  
  uVar1 = GetRandomInteger(this->count);
  LVar2 = Location::Tagged((RecyclerTestObject **)
                           (&this[1].super_RecyclerTestObject.super_IRecyclerVisitedObject + uVar1))
  ;
  location->location = LVar2.location;
  location->type = LVar2.type;
  return true;
}

Assistant:

virtual bool TryGetRandomLocation(Location * location) override
    {
        // Get a random slot and construct a Location for it
        *location = Location::Tagged(&references[GetRandomInteger(count)]);

        return true;
    }